

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O0

int __thiscall IlmThread::Semaphore::value(Semaphore *this)

{
  int iVar1;
  long in_RDI;
  int value;
  allocator *text;
  allocator local_31;
  string local_30 [36];
  int local_c [3];
  
  iVar1 = sem_getvalue((sem_t *)(in_RDI + 8),local_c);
  if (iVar1 != 0) {
    text = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Cannot read semaphore value (%T).",text);
    Iex::throwErrnoExc((string *)text);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return local_c[0];
}

Assistant:

int
Semaphore::value () const
{
    int value;

    if (::sem_getvalue (&_semaphore, &value))
        IEX_NAMESPACE::throwErrnoExc ("Cannot read semaphore value (%T).");

    return value;
}